

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O0

int npf_vpprintf(npf_putc pc,void *pc_ctx,char *format,__va_list_tag *args)

{
  char cVar1;
  uint uVar2;
  longdouble *plVar3;
  bool bVar4;
  char local_329;
  double *local_328;
  npf_uint_t *local_308;
  uint_fast8_t local_2f4;
  npf_uint_t *local_2f0;
  npf_uint_t *local_2d8;
  npf_uint_t *local_2c0;
  npf_uint_t *local_2a8;
  npf_uint_t *local_290;
  uint *local_278;
  uint *local_260;
  uint *local_248;
  uint *local_230;
  char local_209;
  npf_uint_t *local_208;
  npf_uint_t *local_1f0;
  npf_uint_t *local_1d8;
  npf_uint_t *local_1c0;
  npf_uint_t *local_1a8;
  undefined4 *local_190;
  int *local_178;
  undefined4 *local_160;
  int *local_148;
  undefined8 *local_120;
  undefined4 *local_108;
  int *local_e8;
  int local_d4;
  int local_c4;
  double dStack_c0;
  int i;
  double val_2;
  npf_uint_t nStack_b0;
  uint_fast8_t base;
  npf_uint_t val_1;
  npf_uint_t uval;
  npf_int_t val;
  char *s;
  int prec_pad;
  int need_0x;
  int cbuf_len;
  char sign_c;
  char *cbuf;
  anon_union_24_2_9e8356ad u;
  npf_putc p_Stack_58;
  int fs_len;
  npf_cnt_putc_ctx_t pc_cnt;
  char *cur;
  char local_30;
  char local_2f;
  char local_2e;
  char local_2d;
  npf_format_spec_t fs;
  __va_list_tag *args_local;
  char *format_local;
  void *pc_ctx_local;
  npf_putc pc_local;
  
  pc_cnt.ctx._0_4_ = 0;
  p_Stack_58 = pc;
  pc_cnt.pc = (npf_putc)pc_ctx;
  pc_cnt._16_8_ = format;
  fs._4_8_ = args;
  while (*(char *)pc_cnt._16_8_ != '\0') {
    if (*(char *)pc_cnt._16_8_ == '%') {
      local_d4 = npf_parse_format_spec((char *)pc_cnt._16_8_,(npf_format_spec_t *)((long)&cur + 4));
    }
    else {
      local_d4 = 0;
    }
    u._20_4_ = local_d4;
    if (local_d4 == 0) {
      cVar1 = *(char *)pc_cnt._16_8_;
      pc_cnt._16_8_ = pc_cnt._16_8_ + 1;
      npf_putc_cnt((int)cVar1,&stack0xffffffffffffffa8);
    }
    else {
      pc_cnt._16_8_ = pc_cnt._16_8_ + (long)local_d4;
      if (local_30 == '\x02') {
        uVar2 = *(uint *)fs._4_8_;
        if (uVar2 < 0x29) {
          local_e8 = (int *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
          *(uint *)fs._4_8_ = uVar2 + 8;
        }
        else {
          local_e8 = *(int **)(fs._4_8_ + 8);
          *(int **)(fs._4_8_ + 8) = local_e8 + 2;
        }
        cur._4_4_ = *local_e8;
        if (cur._4_4_ < 0) {
          local_30 = '\0';
        }
      }
      _cbuf_len = &cbuf;
      need_0x._3_1_ = '\0';
      prec_pad = 0;
      s._4_4_ = 0;
      s._0_4_ = 0;
      switch(fs.prec._1_1_) {
      case '\x01':
        cbuf._0_1_ = 0x25;
        prec_pad = 1;
        break;
      case '\x02':
        uVar2 = *(uint *)fs._4_8_;
        if (uVar2 < 0x29) {
          local_108 = (undefined4 *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
          *(uint *)fs._4_8_ = uVar2 + 8;
        }
        else {
          local_108 = *(undefined4 **)(fs._4_8_ + 8);
          *(undefined4 **)(fs._4_8_ + 8) = local_108 + 2;
        }
        cbuf._0_1_ = (char)*local_108;
        prec_pad = 1;
        break;
      case '\x03':
        uVar2 = *(uint *)fs._4_8_;
        if (uVar2 < 0x29) {
          local_120 = (undefined8 *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
          *(uint *)fs._4_8_ = uVar2 + 8;
        }
        else {
          local_120 = *(undefined8 **)(fs._4_8_ + 8);
          *(undefined8 **)(fs._4_8_ + 8) = local_120 + 1;
        }
        _cbuf_len = (char **)*local_120;
        val = (npf_int_t)_cbuf_len;
        while( true ) {
          if (((local_30 == '\0') || (bVar4 = false, prec_pad < cur._4_4_)) &&
             (bVar4 = false, _cbuf_len != (char **)0x0)) {
            bVar4 = *(char *)val != '\0';
          }
          if (!bVar4) break;
          val = val + 1;
          prec_pad = prec_pad + 1;
        }
        break;
      case '\x04':
        uval = 0;
        switch((char)fs.prec) {
        case '\0':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_148 = (int *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_148 = *(int **)(fs._4_8_ + 8);
            *(int **)(fs._4_8_ + 8) = local_148 + 2;
          }
          uval = (npf_uint_t)*local_148;
          break;
        case '\x01':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_160 = (undefined4 *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_160 = *(undefined4 **)(fs._4_8_ + 8);
            *(undefined4 **)(fs._4_8_ + 8) = local_160 + 2;
          }
          uval = (npf_uint_t)(short)*local_160;
          break;
        case '\x02':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_178 = (int *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_178 = *(int **)(fs._4_8_ + 8);
            *(int **)(fs._4_8_ + 8) = local_178 + 2;
          }
          uval = (npf_uint_t)*local_178;
          break;
        case '\x03':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_190 = (undefined4 *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_190 = *(undefined4 **)(fs._4_8_ + 8);
            *(undefined4 **)(fs._4_8_ + 8) = local_190 + 2;
          }
          uval = (npf_uint_t)(char)*local_190;
          break;
        case '\x04':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_1a8 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_1a8 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_1a8 + 1;
          }
          uval = *local_1a8;
          break;
        case '\x05':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_1c0 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_1c0 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_1c0 + 1;
          }
          uval = *local_1c0;
          break;
        case '\x06':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_1d8 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_1d8 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_1d8 + 1;
          }
          uval = *local_1d8;
          break;
        case '\a':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_1f0 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_1f0 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_1f0 + 1;
          }
          uval = *local_1f0;
          break;
        case '\b':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_208 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_208 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_208 + 1;
          }
          uval = *local_208;
        }
        if ((long)uval < 0) {
          local_209 = '-';
        }
        else {
          local_209 = local_2f;
        }
        need_0x._3_1_ = local_209;
        if (((uval == 0) && (local_30 != '\0')) && (cur._4_4_ == 0)) {
          prec_pad = 0;
        }
        else {
          val_1 = uval;
          if ((long)uval < 0) {
            val_1 = -uval;
          }
          prec_pad = npf_utoa_rev(val_1,(char *)_cbuf_len,'\n',local_2d);
        }
        break;
      case '\x05':
      case '\x06':
      case '\a':
        nStack_b0 = 0;
        switch((char)fs.prec) {
        case '\0':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_230 = (uint *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_230 = *(uint **)(fs._4_8_ + 8);
            *(uint **)(fs._4_8_ + 8) = local_230 + 2;
          }
          nStack_b0 = (npf_uint_t)*local_230;
          break;
        case '\x01':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_248 = (uint *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_248 = *(uint **)(fs._4_8_ + 8);
            *(uint **)(fs._4_8_ + 8) = local_248 + 2;
          }
          nStack_b0 = (npf_uint_t)(*local_248 & 0xffff);
          break;
        case '\x02':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_260 = (uint *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_260 = *(uint **)(fs._4_8_ + 8);
            *(uint **)(fs._4_8_ + 8) = local_260 + 2;
          }
          nStack_b0 = (npf_uint_t)*local_260;
          break;
        case '\x03':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_278 = (uint *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_278 = *(uint **)(fs._4_8_ + 8);
            *(uint **)(fs._4_8_ + 8) = local_278 + 2;
          }
          nStack_b0 = (npf_uint_t)(*local_278 & 0xff);
          break;
        case '\x04':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_290 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_290 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_290 + 1;
          }
          nStack_b0 = *local_290;
          break;
        case '\x05':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_2a8 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_2a8 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_2a8 + 1;
          }
          nStack_b0 = *local_2a8;
          break;
        case '\x06':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_2c0 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_2c0 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_2c0 + 1;
          }
          nStack_b0 = *local_2c0;
          break;
        case '\a':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_2d8 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_2d8 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_2d8 + 1;
          }
          nStack_b0 = *local_2d8;
          break;
        case '\b':
          uVar2 = *(uint *)fs._4_8_;
          if (uVar2 < 0x29) {
            local_2f0 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)fs._4_8_ = uVar2 + 8;
          }
          else {
            local_2f0 = *(npf_uint_t **)(fs._4_8_ + 8);
            *(npf_uint_t **)(fs._4_8_ + 8) = local_2f0 + 1;
          }
          nStack_b0 = *local_2f0;
        }
        if (((nStack_b0 == 0) && (local_30 != '\0')) && (cur._4_4_ == 0)) {
          if ((fs.prec._1_1_ == '\x05') && (local_2e != '\0')) {
            cur._4_4_ = 1;
          }
        }
        else {
          if (fs.prec._1_1_ == '\x05') {
            local_2f4 = '\b';
          }
          else {
            local_2f4 = '\n';
            if (fs.prec._1_1_ == '\x06') {
              local_2f4 = '\x10';
            }
          }
          prec_pad = npf_utoa_rev(nStack_b0,(char *)_cbuf_len,local_2f4,local_2d);
        }
        if (((nStack_b0 != 0) && (local_2e != '\0')) && (fs.prec._1_1_ == '\x05')) {
          *(char *)((long)_cbuf_len + (long)prec_pad) = '0';
          prec_pad = prec_pad + 1;
        }
        if ((nStack_b0 != 0) && (local_2e != '\0')) {
          if (fs.prec._1_1_ == '\x06') {
            s._4_4_ = 0x58;
          }
          if (s._4_4_ != 0) {
            s._4_4_ = local_2d + s._4_4_;
          }
        }
        break;
      case '\b':
        uVar2 = *(uint *)fs._4_8_;
        if (uVar2 < 0x29) {
          local_308 = (npf_uint_t *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
          *(uint *)fs._4_8_ = uVar2 + 8;
        }
        else {
          local_308 = *(npf_uint_t **)(fs._4_8_ + 8);
          *(npf_uint_t **)(fs._4_8_ + 8) = local_308 + 1;
        }
        prec_pad = npf_utoa_rev(*local_308,(char *)_cbuf_len,'\x10',' ');
        s._4_4_ = 0x78;
        break;
      case '\t':
      case '\n':
      case '\v':
      case '\f':
        if ((char)fs.prec == '\x02') {
          plVar3 = (longdouble *)(*(long *)(fs._4_8_ + 8) + 0xfU & 0xfffffffffffffff0);
          *(longdouble **)(fs._4_8_ + 8) = plVar3 + 1;
          dStack_c0 = (double)*plVar3;
        }
        else {
          uVar2 = *(uint *)(fs._4_8_ + 4);
          if (uVar2 < 0xa1) {
            local_328 = (double *)((long)(int)uVar2 + *(long *)(fs._4_8_ + 0x10));
            *(uint *)(fs._4_8_ + 4) = uVar2 + 0x10;
          }
          else {
            local_328 = *(double **)(fs._4_8_ + 8);
            *(double **)(fs._4_8_ + 8) = local_328 + 1;
          }
          dStack_c0 = *local_328;
        }
        if (0.0 <= dStack_c0) {
          local_329 = local_2f;
        }
        else {
          local_329 = '-';
        }
        need_0x._3_1_ = local_329;
        prec_pad = npf_ftoa_rev((char *)_cbuf_len,(npf_format_spec_t *)((long)&cur + 4),dStack_c0);
      }
      if (((fs.prec._1_1_ != '\x03') && (fs.prec._1_1_ != '\t')) &&
         ((fs.prec._1_1_ != '\n' && ((fs.prec._1_1_ != '\v' && (fs.prec._1_1_ != '\f')))))) {
        s._0_4_ = npf_max(0,cur._4_4_ - prec_pad);
      }
      if (s._4_4_ != 0) {
        npf_putc_cnt(0x30,&stack0xffffffffffffffa8);
        npf_putc_cnt(s._4_4_,&stack0xffffffffffffffa8);
      }
      if (fs.prec._1_1_ == '\x03') {
        for (local_c4 = 0; _cbuf_len != (char **)0x0 && local_c4 < prec_pad; local_c4 = local_c4 + 1
            ) {
          npf_putc_cnt((int)*(char *)((long)_cbuf_len + (long)local_c4),&stack0xffffffffffffffa8);
        }
      }
      else {
        if (need_0x._3_1_ != '\0') {
          npf_putc_cnt((int)need_0x._3_1_,&stack0xffffffffffffffa8);
        }
        while (0 < (int)s) {
          npf_putc_cnt(0x30,&stack0xffffffffffffffa8);
          s._0_4_ = (int)s + -1;
        }
        while (0 < prec_pad) {
          npf_putc_cnt((int)*(char *)((long)_cbuf_len + (long)(prec_pad + -1)),
                       &stack0xffffffffffffffa8);
          prec_pad = prec_pad + -1;
        }
      }
    }
  }
  return (int)pc_cnt.ctx;
}

Assistant:

int npf_vpprintf(npf_putc pc, void *pc_ctx, char const *format, va_list args) {
  npf_format_spec_t fs;
  char const *cur = format;
  npf_cnt_putc_ctx_t pc_cnt;
  pc_cnt.pc = pc;
  pc_cnt.ctx = pc_ctx;
  pc_cnt.n = 0;

  while (*cur) {
    int const fs_len = (*cur != '%') ? 0 : npf_parse_format_spec(cur, &fs);
    if (!fs_len) { NPF_PUTC(*cur++); continue; }
    cur += fs_len;

    // Extract star-args immediately
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    if (fs.field_width_opt == NPF_FMT_SPEC_OPT_STAR) {
      fs.field_width = va_arg(args, int);
      if (fs.field_width < 0) {
        fs.field_width = -fs.field_width;
        fs.left_justified = 1;
      }
    }
#endif
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    if (fs.prec_opt == NPF_FMT_SPEC_OPT_STAR) {
      fs.prec = va_arg(args, int);
      if (fs.prec < 0) { fs.prec_opt = NPF_FMT_SPEC_OPT_NONE; }
    }
#endif

    union { char cbuf_mem[NANOPRINTF_CONVERSION_BUFFER_SIZE]; npf_uint_t binval; } u;
    char *cbuf = u.cbuf_mem, sign_c = 0;
    int cbuf_len = 0, need_0x = 0;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    int field_pad = 0;
    char pad_c = 0;
#endif
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    int prec_pad = 0;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    int zero = 0;
#endif
#endif

    // Extract and convert the argument to string, point cbuf at the text.
    switch (fs.conv_spec) {
      case NPF_FMT_SPEC_CONV_PERCENT:
        *cbuf = '%';
        cbuf_len = 1;
        break;

      case NPF_FMT_SPEC_CONV_CHAR:
        *cbuf = (char)va_arg(args, int);
        cbuf_len = 1;
        break;

      case NPF_FMT_SPEC_CONV_STRING: {
        cbuf = va_arg(args, char *);
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
        for (char const *s = cbuf;
             ((fs.prec_opt == NPF_FMT_SPEC_OPT_NONE) || (cbuf_len < fs.prec)) && cbuf && *s;
             ++s, ++cbuf_len);
#else
        for (char const *s = cbuf; cbuf && *s; ++s, ++cbuf_len); // strlen
#endif
      } break;

      case NPF_FMT_SPEC_CONV_SIGNED_INT: {
        npf_int_t val = 0;
        switch (fs.length_modifier) {
          NPF_EXTRACT(NONE, int, int);
          NPF_EXTRACT(SHORT, short, int);
          NPF_EXTRACT(LONG_DOUBLE, int, int);
          NPF_EXTRACT(CHAR, signed char, int);
          NPF_EXTRACT(LONG, long, long);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_EXTRACT(LARGE_LONG_LONG, long long, long long);
          NPF_EXTRACT(LARGE_INTMAX, intmax_t, intmax_t);
          NPF_EXTRACT(LARGE_SIZET, npf_ssize_t, npf_ssize_t);
          NPF_EXTRACT(LARGE_PTRDIFFT, ptrdiff_t, ptrdiff_t);
#endif
          default: break;
        }

        sign_c = (val < 0) ? '-' : fs.prepend;

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = !val;
#endif
        // special case, if prec and value are 0, skip
        if (!val && (fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec) {
          cbuf_len = 0;
        } else
#endif
        {
          npf_uint_t uval = (npf_uint_t)val;
          if (val < 0) { uval = 0 - uval; }
          cbuf_len = npf_utoa_rev(uval, cbuf, 10, fs.case_adjust);
        }
      } break;

#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_BINARY:
#endif
      case NPF_FMT_SPEC_CONV_OCTAL:
      case NPF_FMT_SPEC_CONV_HEX_INT:
      case NPF_FMT_SPEC_CONV_UNSIGNED_INT: {
        npf_uint_t val = 0;

        switch (fs.length_modifier) {
          NPF_EXTRACT(NONE, unsigned, unsigned);
          NPF_EXTRACT(SHORT, unsigned short, unsigned);
          NPF_EXTRACT(LONG_DOUBLE, unsigned, unsigned);
          NPF_EXTRACT(CHAR, unsigned char, unsigned);
          NPF_EXTRACT(LONG, unsigned long, unsigned long);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_EXTRACT(LARGE_LONG_LONG, unsigned long long, unsigned long long);
          NPF_EXTRACT(LARGE_INTMAX, uintmax_t, uintmax_t);
          NPF_EXTRACT(LARGE_SIZET, size_t, size_t);
          NPF_EXTRACT(LARGE_PTRDIFFT, size_t, size_t);
#endif
          default: break;
        }

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = !val;
#endif
        if (!val && (fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec) {
          // Zero value and explicitly-requested zero precision means "print nothing".
          if ((fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL) && fs.alt_form) {
            fs.prec = 1; // octal special case, print a single '0'
          }
        } else
#endif
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
        if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) {
          cbuf_len = npf_bin_len(val); u.binval = val;
        } else
#endif
        {
          uint_fast8_t const base = (fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL) ?
            8u : ((fs.conv_spec == NPF_FMT_SPEC_CONV_HEX_INT) ? 16u : 10u);
          cbuf_len = npf_utoa_rev(val, cbuf, base, fs.case_adjust);
        }

        if (val && fs.alt_form && (fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL)) {
          cbuf[cbuf_len++] = '0'; // OK to add leading octal '0' immediately.
        }

        if (val && fs.alt_form) { // 0x or 0b but can't write it yet.
          if (fs.conv_spec == NPF_FMT_SPEC_CONV_HEX_INT) { need_0x = 'X'; }
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
          else if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) { need_0x = 'B'; }
#endif
          if (need_0x) { need_0x += fs.case_adjust; }
        }
      } break;

      case NPF_FMT_SPEC_CONV_POINTER: {
        cbuf_len =
          npf_utoa_rev((npf_uint_t)(uintptr_t)va_arg(args, void *), cbuf, 16, 'a' - 'A');
        need_0x = 'x';
      } break;

#if NANOPRINTF_USE_WRITEBACK_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_WRITEBACK:
        switch (fs.length_modifier) {
          NPF_WRITEBACK(NONE, int);
          NPF_WRITEBACK(SHORT, short);
          NPF_WRITEBACK(LONG, long);
          NPF_WRITEBACK(LONG_DOUBLE, double);
          NPF_WRITEBACK(CHAR, signed char);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_WRITEBACK(LARGE_LONG_LONG, long long);
          NPF_WRITEBACK(LARGE_INTMAX, intmax_t);
          NPF_WRITEBACK(LARGE_SIZET, size_t);
          NPF_WRITEBACK(LARGE_PTRDIFFT, ptrdiff_t);
#endif
          default: break;
        } break;
#endif

#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_FLOAT_DEC:
      case NPF_FMT_SPEC_CONV_FLOAT_SCI:
      case NPF_FMT_SPEC_CONV_FLOAT_SHORTEST:
      case NPF_FMT_SPEC_CONV_FLOAT_HEX: {
        double val;
        if (fs.length_modifier == NPF_FMT_SPEC_LEN_MOD_LONG_DOUBLE) {
          val = (double)va_arg(args, long double);
        } else {
          val = va_arg(args, double);
        }

        sign_c = (val < 0.) ? '-' : fs.prepend;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = (val == 0.);
#endif
        cbuf_len = npf_ftoa_rev(cbuf, &fs, val);
      } break;
#endif
      default: break;
    }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    // Compute the field width pad character
    if (fs.field_width_opt != NPF_FMT_SPEC_OPT_NONE) {
      if (fs.leading_zero_pad) { // '0' flag is only legal with numeric types
        if ((fs.conv_spec != NPF_FMT_SPEC_CONV_STRING) &&
            (fs.conv_spec != NPF_FMT_SPEC_CONV_CHAR) &&
            (fs.conv_spec != NPF_FMT_SPEC_CONV_PERCENT)) {
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
          if ((fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec && zero) {
            pad_c = ' ';
          } else
#endif
          { pad_c = '0'; }
        }
      } else { pad_c = ' '; }
    }
#endif

    // Compute the number of bytes to truncate or '0'-pad.
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    if (fs.conv_spec != NPF_FMT_SPEC_CONV_STRING) {
#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
      // float precision is after the decimal point
      if ((fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_DEC) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_SCI) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_SHORTEST) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_HEX))
#endif
      { prec_pad = npf_max(0, fs.prec - cbuf_len); }
    }
#endif

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    // Given the full converted length, how many pad bytes?
    field_pad = fs.field_width - cbuf_len - !!sign_c;
    if (need_0x) { field_pad -= 2; }
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    field_pad -= prec_pad;
#endif
    field_pad = npf_max(0, field_pad);

    // Apply right-justified field width if requested
    if (!fs.left_justified && pad_c) { // If leading zeros pad, sign goes first.
      if (pad_c == '0') {
        if (sign_c) { NPF_PUTC(sign_c); sign_c = 0; }
        // Pad byte is '0', write '0x' before '0' pad chars.
        if (need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); }
      }
      while (field_pad-- > 0) { NPF_PUTC(pad_c); }
      // Pad byte is ' ', write '0x' after ' ' pad chars but before number.
      if ((pad_c != '0') && need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); }
    } else
#endif
    { if (need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); } } // no pad, '0x' requested.

    // Write the converted payload
    if (fs.conv_spec == NPF_FMT_SPEC_CONV_STRING) {
      for (int i = 0; cbuf && (i < cbuf_len); ++i) { NPF_PUTC(cbuf[i]); }
    } else {
      if (sign_c) { NPF_PUTC(sign_c); }
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      while (prec_pad-- > 0) { NPF_PUTC('0'); } // int precision leads.
#endif
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
      if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) {
        while (cbuf_len) { NPF_PUTC('0' + ((u.binval >> --cbuf_len) & 1)); }
      } else
#endif
      { while (cbuf_len-- > 0) { NPF_PUTC(cbuf[cbuf_len]); } } // payload is reversed
    }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    if (fs.left_justified && pad_c) { // Apply left-justified field width
      while (field_pad-- > 0) { NPF_PUTC(pad_c); }
    }
#endif
  }

  return pc_cnt.n;
}